

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O0

Matrix<double,__1,__1> __thiscall
Matrix<double,_-1,_-1>::inverse(Matrix<double,__1,__1> *this,int *flag)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  void *this_00;
  double *pdVar7;
  Matrix<double,__1,__1> *pMVar8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double temp_4;
  int k_1;
  double deno_1;
  int j_4;
  double deno;
  int j_3;
  double temp_3;
  int i_1;
  double temp_2;
  int k;
  double factor;
  int j_2;
  double temp_1;
  int j_1;
  double temp;
  double dStack_68;
  int j;
  double value;
  int posi;
  int i;
  undefined1 local_38 [8];
  Matrix<double,__1,__1> copy;
  int *flag_local;
  Matrix<double,__1,__1> *this_local;
  Matrix<double,__1,__1> Identity_;
  
  copy.data = (double *)flag;
  Matrix((Matrix<double,__1,__1> *)&this_local);
  Matrix((Matrix<double,__1,__1> *)local_38);
  operator=((Matrix<double,__1,__1> *)local_38,*this);
  iVar4 = row((Matrix<double,__1,__1> *)local_38);
  iVar5 = col((Matrix<double,__1,__1> *)local_38);
  resize((Matrix<double,__1,__1> *)&this_local,iVar4,iVar5);
  Identity((Matrix<double,__1,__1> *)&this_local);
  iVar4 = col(this);
  iVar5 = row(this);
  if (iVar4 == iVar5) {
    for (value._4_4_ = 0; iVar4 = row((Matrix<double,__1,__1> *)local_38), value._4_4_ < iVar4 + -1;
        value._4_4_ = value._4_4_ + 1) {
      value._0_4_ = value._4_4_;
      pMVar8 = (Matrix<double,__1,__1> *)local_38;
      operator()(pMVar8,value._4_4_,value._4_4_);
      std::abs((int)pMVar8);
      dStack_68 = extraout_XMM0_Qa;
      temp._4_4_ = value._4_4_;
      while( true ) {
        temp._4_4_ = temp._4_4_ + 1;
        pMVar8 = (Matrix<double,__1,__1> *)local_38;
        iVar4 = row(pMVar8);
        if (iVar4 <= temp._4_4_) break;
        pMVar8 = (Matrix<double,__1,__1> *)local_38;
        operator()(pMVar8,temp._4_4_,value._4_4_);
        std::abs((int)pMVar8);
        if (dStack_68 < extraout_XMM0_Qa_00) {
          value._0_4_ = temp._4_4_;
          dStack_68 = extraout_XMM0_Qa_00;
        }
      }
      std::abs((int)pMVar8);
      if (extraout_XMM0_Qa_01 <= 1e-10) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"this matrix is not invertible");
        this_00 = (void *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        *(undefined4 *)copy.data = 1;
        deleteMatrix((Matrix<double,__1,__1> *)local_38);
        return _this_local;
      }
      factor._4_4_ = value._4_4_;
      if (value._0_4_ != value._4_4_) {
        for (temp_1._4_4_ = 0; iVar4 = col((Matrix<double,__1,__1> *)local_38), temp_1._4_4_ < iVar4
            ; temp_1._4_4_ = temp_1._4_4_ + 1) {
          pdVar7 = operator()((Matrix<double,__1,__1> *)local_38,value._4_4_,temp_1._4_4_);
          dVar1 = *pdVar7;
          pdVar7 = operator()((Matrix<double,__1,__1> *)local_38,value._0_4_,temp_1._4_4_);
          SetElement((Matrix<double,__1,__1> *)local_38,value._4_4_,temp_1._4_4_,*pdVar7);
          SetElement((Matrix<double,__1,__1> *)local_38,value._0_4_,temp_1._4_4_,dVar1);
          pdVar7 = operator()((Matrix<double,__1,__1> *)&this_local,value._4_4_,temp_1._4_4_);
          dVar1 = *pdVar7;
          pdVar7 = operator()((Matrix<double,__1,__1> *)&this_local,value._0_4_,temp_1._4_4_);
          SetElement((Matrix<double,__1,__1> *)&this_local,value._4_4_,temp_1._4_4_,*pdVar7);
          SetElement((Matrix<double,__1,__1> *)&this_local,value._0_4_,temp_1._4_4_,dVar1);
        }
      }
      while( true ) {
        factor._4_4_ = factor._4_4_ + 1;
        iVar4 = row((Matrix<double,__1,__1> *)local_38);
        if (iVar4 <= factor._4_4_) break;
        pdVar7 = operator()((Matrix<double,__1,__1> *)local_38,factor._4_4_,value._4_4_);
        dVar1 = *pdVar7;
        pdVar7 = operator()((Matrix<double,__1,__1> *)local_38,value._4_4_,value._4_4_);
        dVar2 = *pdVar7;
        for (temp_2._4_4_ = 0; iVar4 = col((Matrix<double,__1,__1> *)local_38), temp_2._4_4_ < iVar4
            ; temp_2._4_4_ = temp_2._4_4_ + 1) {
          pdVar7 = operator()((Matrix<double,__1,__1> *)local_38,factor._4_4_,temp_2._4_4_);
          dVar3 = *pdVar7;
          pdVar7 = operator()((Matrix<double,__1,__1> *)local_38,value._4_4_,temp_2._4_4_);
          SetElement((Matrix<double,__1,__1> *)local_38,factor._4_4_,temp_2._4_4_,
                     -*pdVar7 * (dVar1 / dVar2) + dVar3);
          pdVar7 = operator()((Matrix<double,__1,__1> *)&this_local,factor._4_4_,temp_2._4_4_);
          dVar3 = *pdVar7;
          pdVar7 = operator()((Matrix<double,__1,__1> *)&this_local,value._4_4_,temp_2._4_4_);
          SetElement((Matrix<double,__1,__1> *)&this_local,factor._4_4_,temp_2._4_4_,
                     -*pdVar7 * (dVar1 / dVar2) + dVar3);
        }
      }
    }
    temp_3._4_4_ = row((Matrix<double,__1,__1> *)local_38);
    while (temp_3._4_4_ = temp_3._4_4_ + -1, -1 < temp_3._4_4_) {
      pMVar8 = (Matrix<double,__1,__1> *)local_38;
      pdVar7 = operator()(pMVar8,temp_3._4_4_,temp_3._4_4_);
      dVar1 = *pdVar7;
      std::abs((int)pMVar8);
      if (extraout_XMM0_Qa_02 <= 1e-15) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"this matrix is not invertible");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        *(undefined4 *)copy.data = 1;
        deleteMatrix((Matrix<double,__1,__1> *)local_38);
        return _this_local;
      }
      for (deno._4_4_ = 0; iVar4 = col((Matrix<double,__1,__1> *)local_38), deno._4_4_ < iVar4;
          deno._4_4_ = deno._4_4_ + 1) {
        pdVar7 = operator()((Matrix<double,__1,__1> *)local_38,temp_3._4_4_,deno._4_4_);
        SetElement((Matrix<double,__1,__1> *)local_38,temp_3._4_4_,deno._4_4_,*pdVar7 / dVar1);
        pdVar7 = operator()((Matrix<double,__1,__1> *)&this_local,temp_3._4_4_,deno._4_4_);
        SetElement((Matrix<double,__1,__1> *)&this_local,temp_3._4_4_,deno._4_4_,*pdVar7 / dVar1);
      }
      for (deno_1._4_4_ = 0; deno_1._4_4_ < temp_3._4_4_; deno_1._4_4_ = deno_1._4_4_ + 1) {
        pdVar7 = operator()((Matrix<double,__1,__1> *)local_38,deno_1._4_4_,temp_3._4_4_);
        dVar1 = *pdVar7;
        for (temp_4._4_4_ = 0; iVar4 = col((Matrix<double,__1,__1> *)local_38), temp_4._4_4_ < iVar4
            ; temp_4._4_4_ = temp_4._4_4_ + 1) {
          pdVar7 = operator()((Matrix<double,__1,__1> *)local_38,deno_1._4_4_,temp_4._4_4_);
          dVar2 = *pdVar7;
          pdVar7 = operator()((Matrix<double,__1,__1> *)local_38,temp_3._4_4_,temp_4._4_4_);
          SetElement((Matrix<double,__1,__1> *)local_38,deno_1._4_4_,temp_4._4_4_,
                     -*pdVar7 * dVar1 + dVar2);
          pdVar7 = operator()((Matrix<double,__1,__1> *)&this_local,deno_1._4_4_,temp_4._4_4_);
          dVar2 = *pdVar7;
          pdVar7 = operator()((Matrix<double,__1,__1> *)&this_local,temp_3._4_4_,temp_4._4_4_);
          SetElement((Matrix<double,__1,__1> *)&this_local,deno_1._4_4_,temp_4._4_4_,
                     -*pdVar7 * dVar1 + dVar2);
        }
      }
    }
    *(undefined4 *)copy.data = 0;
    deleteMatrix((Matrix<double,__1,__1> *)local_38);
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cerr,
                             "only square matrix can call this function(inverse)");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    *(undefined4 *)copy.data = 1;
    deleteMatrix((Matrix<double,__1,__1> *)local_38);
  }
  return _this_local;
}

Assistant:

Matrix<Type, _0, _1> Matrix<Type, _0, _1>::inverse(int &flag)
{
    // 此单位阵为待求逆矩阵的增广矩阵
    Matrix<Type, _0, _1> Identity_;
    Matrix<Type, _0, _1> copy;
    copy = (*this);

    if(_0 == Dynamic || _1 == Dynamic)
        Identity_.resize(copy.row(), copy.col());
    Identity_.Identity();

    if(this->col() != this->row())
    {
        cerr << "only square matrix can call this function(inverse)" << endl;
        flag = 1;
        copy.deleteMatrix();
        return Identity_;
    }
    // cout << copy << endl << endl;

    // 将主元置于对角线上
    for (int i = 0; i < copy.row() - 1; ++i)
    {
        // 目前主元位置
        // i行i列
        int posi = i;
        // 初始化主元绝对值大小
        Type value = abs(copy.operator()(i, i));

        // 对第 i+1行开始寻找真正主元
        for(int j = i + 1; j < copy.row(); ++j)
        {
            Type temp = abs(copy.operator()(j, i));
            if(temp > value)
            {
                posi = j;
                value = temp;
            }
        }
        // 若主元为0  则矩阵不可逆
        if (abs(value) <= 1e-10)
        {
            cerr << "this matrix is not invertible" << endl << endl;
            flag = 1;
            copy.deleteMatrix();
            return Identity_;
        }
        // 如果主元不在第i行 则交换两行
        // 同时也要将增广矩阵（单位矩阵）交换相应的两行
        if(posi != i)
        {
            for(int j = 0; j < copy.col(); ++j)
            {
                // 先交换矩阵
                Type temp = copy.operator()(i, j);
                copy.SetElement(i, j, copy.operator()(posi, j));
                copy.SetElement(posi, j, temp);

                // 交换单位阵
                temp = Identity_(i, j);
                Identity_.SetElement(i, j, Identity_(posi, j));
                Identity_.SetElement(posi, j, temp);
            }
        }

        // 将下三角矩阵变为0 (应该可以减少一个循环)
        // 经过实践 并不能少循环
        for(int j = i + 1; j < copy.row(); ++j)
        {
            Type factor = copy.operator()(j, i) / copy.operator()(i, i);
            for(int k = 0; k < copy.col(); ++k)
            {
                Type temp = copy.operator()(j, k) - copy.operator()(i, k) * factor;
                copy.SetElement(j, k, temp);

                temp = Identity_(j, k) - Identity_(i, k) * factor;
                Identity_.SetElement(j, k, temp);
            }
        }
    }

    // 判断对角元素是否为0
    // 若为0则矩阵不可逆
    // 若不为0 则将对角置为1 
    // 且将上三角置为0
    for(int i = copy.row() - 1; i > -1; --i)
    {
        Type temp = copy.operator()(i, i);
        if(abs(temp) <= 1e-15)
        {
            cerr << "this matrix is not invertible" << endl;
            flag = 1;
            copy.deleteMatrix();
            return Identity_;
        }
        // 将对角置1
        for(int j = 0; j < copy.col(); ++j)
        {
            Type deno = copy.operator()(i, j) / temp;
            copy.SetElement(i, j, deno);

            deno = Identity_(i, j) / temp;
            Identity_.SetElement(i, j, deno);
        }
        // 同样的方法上三角置0
        for(int j = 0; j < i; ++j)
        {
            Type deno = copy.operator()(j, i);
            for(int k = 0; k < copy.col(); ++k)
            {
                Type temp = copy.operator()(j, k) - copy.operator()(i, k) * deno;
                copy.SetElement(j, k, temp);
                temp = Identity_(j, k) - Identity_(i, k) * deno;
                Identity_.SetElement(j, k, temp);
            }
        }
    }
    flag = 0;
    copy.deleteMatrix();
    return Identity_;
}